

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>>
::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>>
           *this,vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *orderedBoundaries,Column_settings *colSettings)

{
  long lVar1;
  uint uVar2;
  Index columnIndex;
  uint uVar3;
  long lVar4;
  size_type __new_size;
  ulong uVar5;
  uint local_4c;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>>
  *local_48;
  initializer_list<unsigned_int> local_40;
  
  *(undefined8 *)(this + 0x20) = 0;
  *(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>>
    **)this = this + 0x30;
  *(undefined8 *)(this + 8) = 1;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined4 *)(this + 0x20) = 0x3f800000;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  *(undefined8 *)(this + 0x60) = 0;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>>
  ::Boundary_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>>
              *)(this + 0x68),orderedBoundaries,colSettings);
  local_48 = (Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>>
              *)(this + 0x68);
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>
  ::Base_matrix((Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>
                 *)(this + 0xd0),
                (int)((ulong)((long)(orderedBoundaries->
                                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(orderedBoundaries->
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555,
                colSettings);
  *(undefined8 *)(this + 0x138) = 0;
  *(undefined8 *)(this + 0x140) = 0;
  *(undefined8 *)(this + 0x148) = 0;
  __new_size = ((long)(orderedBoundaries->
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(orderedBoundaries->
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  *(int *)(this + 0x150) = (int)__new_size;
  *(undefined8 *)(this + 0x158) = 0;
  local_40._M_array = (iterator)CONCAT44(local_40._M_array._4_4_,0xffffffff);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + 0x138),__new_size,
             (value_type_conflict1 *)&local_40);
  if (*(int *)(this + 0xc0) != 0) {
    columnIndex = *(Index *)(this + 0x128);
    uVar3 = 0;
    do {
      local_40._M_len = 1;
      local_4c = uVar3;
      local_40._M_array = &local_4c;
      Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>>
      ::_insert<std::initializer_list<unsigned_int>>
                ((Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>>
                  *)(this + 0xd0),&local_40,columnIndex,0);
      columnIndex = *(int *)(this + 0x128) + 1;
      *(Index *)(this + 0x128) = columnIndex;
      uVar3 = uVar3 + 1;
      uVar2 = *(uint *)(this + 0xc0);
    } while (uVar3 < uVar2);
    if (uVar2 != 0) {
      lVar4 = 0x28;
      uVar5 = 0;
      do {
        lVar1 = *(long *)(*(long *)(this + 0xa8) + lVar4);
        if (*(long *)(this + 0xa8) + lVar4 != lVar1 && lVar1 != 0) {
          RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>
          ::_reduce_column((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>
                            *)this,(Index)uVar5,(Index)uVar5);
          uVar2 = *(uint *)(this + 0xc0);
        }
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x38;
      } while (uVar5 < uVar2);
    }
  }
  return;
}

Assistant:

inline RU_matrix<Master_matrix>::RU_matrix(const std::vector<Boundary_range>& orderedBoundaries,
                                           Column_settings* colSettings)
    : Pair_opt(),
      Swap_opt(),
      Rep_opt(),
      reducedMatrixR_(orderedBoundaries, colSettings),
      mirrorMatrixU_(orderedBoundaries.size(), colSettings),
      nextEventIndex_(orderedBoundaries.size()),
      operators_(nullptr)
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    operators_ = &(colSettings->operators);
  }

  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    pivotToColumnIndex_.reserve(orderedBoundaries.size());
  } else {
    pivotToColumnIndex_.resize(orderedBoundaries.size(), Master_matrix::template get_null_value<Index>());
  }

  _initialize_U();
  _reduce();
}